

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O2

void __thiscall unit_test::delayed_with_response(unit_test *this)

{
  ptime pVar1;
  intrusive_ptr<unit_test> local_48;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> local_40;
  binder local_30;
  
  cppcms::application::release_context();
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->context_).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>
             ,&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  pVar1 = booster::ptime::milliseconds(300);
  pVar1._8_8_ = pVar1.sec;
  pVar1.sec = (longlong)&this->timer_;
  booster::aio::deadline_timer::expires_from_now(pVar1);
  local_48.p_ = this;
  booster::intrusive_ptr_add_ref(&this->super_application);
  booster::intrusive_ptr<unit_test>::intrusive_ptr(&local_30.self,&local_48);
  local_30.m = (member_type)handle2;
  local_30._16_8_ = 0;
  booster::callback<void_(const_std::error_code_&)>::callback<unit_test::binder>
            ((callback<void_(const_std::error_code_&)> *)&local_40,&local_30);
  booster::aio::deadline_timer::async_wait((callback *)&this->timer_);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            ((intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> *)&local_40);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_30.self);
  booster::intrusive_ptr<unit_test>::~intrusive_ptr(&local_48);
  return;
}

Assistant:

void delayed_with_response()
	{
		context_ = release_context();
		timer_.expires_from_now(booster::ptime::milliseconds(300));
		timer_.async_wait(binder(this,&unit_test::handle2));
	}